

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xpath_allocator_capture::~xpath_allocator_capture
          (xpath_allocator_capture *this)

{
  xpath_allocator *pxVar1;
  xpath_memory_block *pxVar2;
  xpath_memory_block *pxVar3;
  xpath_memory_block *pxVar4;
  
  pxVar1 = this->_target;
  pxVar3 = (this->_state)._root;
  pxVar4 = pxVar1->_root;
  while (pxVar4 != pxVar3) {
    pxVar2 = pxVar4->next;
    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              (pxVar4);
    pxVar4 = pxVar2;
    pxVar3 = (this->_state)._root;
  }
  pxVar1->_root = pxVar3;
  pxVar1->_root_size = (this->_state)._root_size;
  return;
}

Assistant:

~xpath_allocator_capture()
		{
			_target->revert(_state);
		}